

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteString
               (int field_number,string *value,CodedOutputStream *output)

{
  string *this;
  uint32_t value_00;
  unsigned_long t;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_50 [23];
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  string *local_28;
  string *absl_log_internal_check_op_result;
  CodedOutputStream *output_local;
  string *value_local;
  int field_number_local;
  
  absl_log_internal_check_op_result = (string *)output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  t = std::__cxx11::string::size();
  local_30 = absl::lts_20240722::log_internal::GetReferenceableValue(t);
  local_38 = absl::lts_20240722::log_internal::GetReferenceableValue(0x7fffffff);
  local_28 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,"value.size() <= kInt32MaxSize");
  this = absl_log_internal_check_op_result;
  if (local_28 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/wire_format_lite.cc"
               ,0x1de,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  value_00 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)this,value_00);
  io::CodedOutputStream::WriteString
            ((CodedOutputStream *)absl_log_internal_check_op_result,(string *)output_local);
  return;
}

Assistant:

void WireFormatLite::WriteString(int field_number, const std::string& value,
                                 io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}